

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O1

bool __thiscall FWallCoords::Init(FWallCoords *this,DVector2 *pt1,DVector2 *pt2,double too_close)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float temp;
  float fVar9;
  float fVar10;
  
  dVar6 = ViewSin;
  dVar5 = ViewCos;
  dVar1 = pt1->X;
  dVar2 = pt1->Y;
  fVar7 = (float)(ViewSin * dVar1 - ViewCos * dVar2);
  (this->tleft).X = fVar7;
  dVar3 = pt2->X;
  dVar4 = pt2->Y;
  fVar8 = (float)(dVar6 * dVar3 - dVar5 * dVar4);
  (this->tright).X = fVar8;
  fVar9 = (float)(dVar2 * ViewTanSin + dVar1 * ViewTanCos);
  fVar10 = (float)(ViewTanSin * dVar4 + ViewTanCos * dVar3);
  (this->tleft).Y = fVar9;
  (this->tright).Y = fVar10;
  if (((byte)MirrorFlags & 1) != 0) {
    (this->tleft).X = -fVar8;
    (this->tright).X = -fVar7;
    (this->tleft).Y = fVar10;
    (this->tright).Y = fVar9;
  }
  fVar7 = (this->tleft).X;
  fVar8 = (this->tleft).Y;
  if (-fVar8 <= fVar7) {
    if (fVar8 < fVar7) {
      return true;
    }
    if (fVar8 == 0.0) {
      return true;
    }
    this->sx1 = SUB82(CenterX + 6755399441055744.0 + ((double)fVar7 * CenterX) / (double)fVar8,0);
    fVar9 = fVar8;
  }
  else {
    fVar9 = (this->tright).X;
    fVar10 = (this->tright).Y;
    if (fVar9 < -fVar10) {
      return true;
    }
    fVar9 = (fVar8 + fVar7) - (fVar9 + fVar10);
    if (fVar9 == 0.0) {
      return true;
    }
    this->sx1 = 0;
    fVar9 = ((fVar10 - fVar8) * (fVar8 + fVar7)) / fVar9 + fVar8;
  }
  this->sz1 = fVar9;
  if (too_close <= (double)fVar9) {
    fVar9 = (this->tright).X;
    fVar10 = (this->tright).Y;
    if (fVar9 <= fVar10) {
      if (fVar9 < -fVar10) {
        return true;
      }
      if (fVar10 == 0.0) {
        return true;
      }
      this->sx2 = SUB82(CenterX + 6755399441055744.0 + ((double)fVar9 * CenterX) / (double)fVar10,0)
      ;
    }
    else {
      if (fVar8 < fVar7) {
        return true;
      }
      fVar9 = (fVar7 - (fVar9 + fVar8)) + fVar10;
      if (fVar9 == 0.0) {
        return true;
      }
      this->sx2 = (short)viewwidth;
      fVar10 = ((fVar7 - fVar8) * (fVar10 - fVar8)) / fVar9 + fVar8;
    }
    this->sz2 = fVar10;
    if (too_close <= (double)fVar10) {
      return this->sx2 <= this->sx1;
    }
  }
  return true;
}

Assistant:

bool FWallCoords::Init(const DVector2 &pt1, const DVector2 &pt2, double too_close)
{
	tleft.X =  float(pt1.X * ViewSin - pt1.Y * ViewCos);
	tright.X = float(pt2.X * ViewSin - pt2.Y * ViewCos);

	tleft.Y =  float(pt1.X * ViewTanCos + pt1.Y * ViewTanSin);
	tright.Y = float(pt2.X * ViewTanCos + pt2.Y * ViewTanSin);

	if (MirrorFlags & RF_XFLIP)
	{
		float t = -tleft.X;
		tleft.X = -tright.X;
		tright.X = t;
		swapvalues(tleft.Y, tright.Y);
	}

	if (tleft.X >= -tleft.Y)
	{
		if (tleft.X > tleft.Y) return true;	// left edge is off the right side
		if (tleft.Y == 0) return true;
		sx1 = xs_RoundToInt(CenterX + tleft.X * CenterX / tleft.Y);
		sz1 = tleft.Y;
	}
	else
	{
		if (tright.X < -tright.Y) return true;	// wall is off the left side
		float den = tleft.X - tright.X - tright.Y + tleft.Y;
		if (den == 0) return true;
		sx1 = 0;
		sz1 = tleft.Y + (tright.Y - tleft.Y) * (tleft.X + tleft.Y) / den;
	}

	if (sz1 < too_close)
		return true;

	if (tright.X <= tright.Y)
	{
		if (tright.X < -tright.Y) return true;	// right edge is off the left side
		if (tright.Y == 0) return true;
		sx2 = xs_RoundToInt(CenterX + tright.X * CenterX / tright.Y);
		sz2 = tright.Y;
	}
	else
	{
		if (tleft.X > tleft.Y) return true;	// wall is off the right side
		float den = tright.Y - tleft.Y - tright.X + tleft.X;
		if (den == 0) return true;
		sx2 = viewwidth;
		sz2 = tleft.Y + (tright.Y - tleft.Y) * (tleft.X - tleft.Y) / den;
	}

	if (sz2 < too_close || sx2 <= sx1)
		return true;

	return false;
}